

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolverTypes.h
# Opt level: O2

CRef __thiscall Minisat::ClauseAllocator::alloc(ClauseAllocator *this,Clause *from)

{
  Ref r;
  Clause *this_00;
  uint uVar1;
  
  uVar1 = (uint)from->header >> 2 & 1 | (uint)this->extra_clause_field;
  r = RegionAllocator<unsigned_int>::alloc(&this->ra,((uint)from->header >> 5) + uVar1 + 1);
  this_00 = (Clause *)RegionAllocator<unsigned_int>::lea(&this->ra,r);
  Clause::Clause(this_00,from,SUB41(uVar1,0));
  return r;
}

Assistant:

CRef alloc(const Clause& from)
    {
        bool use_extra = from.learnt() | extra_clause_field;
        CRef cid       = ra.alloc(clauseWord32Size(from.size(), use_extra));
        new (lea(cid)) Clause(from, use_extra);
        return cid; }